

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::CFG::preds(CFG *this,uint32_t blk_id)

{
  const_iterator cVar1;
  uint32_t local_c;
  
  local_c = blk_id;
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->label2preds_)._M_h,&local_c);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    __assert_fail("label2preds_.count(blk_id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.h"
                  ,0x24,"const std::vector<uint32_t> &spvtools::opt::CFG::preds(uint32_t) const");
  }
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->label2preds_)._M_h,&local_c);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           ((long)cVar1.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                  ._M_cur + 0x10);
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

const std::vector<uint32_t>& preds(uint32_t blk_id) const {
    assert(label2preds_.count(blk_id));
    return label2preds_.at(blk_id);
  }